

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::compute_sum_into(char *new_ext,char *ext1,char *ext2)

{
  int iVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000050;
  char *in_stack_00000058;
  char *in_stack_00000060;
  
  iVar1 = get_neg(in_RSI);
  iVar2 = get_neg(in_RDX);
  if (iVar1 == iVar2) {
    compute_abs_sum_into(in_stack_00000030,in_stack_00000028,new_ext);
    iVar1 = get_neg(in_RSI);
    set_neg(in_RDI,iVar1);
  }
  else {
    iVar1 = get_neg(in_RSI);
    if (iVar1 == 0) {
      compute_abs_diff_into(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
    else {
      compute_abs_diff_into(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_sum_into(char *new_ext,
                                    const char *ext1, const char *ext2)
{
    /* check to see if the numbers have the same sign */
    if (get_neg(ext1) == get_neg(ext2))
    {
        /*
         *   the two numbers have the same sign, so the sum has the same sign
         *   as the two values, and the magnitude is the sum of the absolute
         *   values of the operands
         */

        /* compute the sum of the absolute values */
        compute_abs_sum_into(new_ext, ext1, ext2);

        /* set the sign to match that of the operand */
        set_neg(new_ext, get_neg(ext1));
    }
    else
    {
        /* 
         *   one is positive and the other is negative - subtract the
         *   absolute value of the negative one from the absolute value of
         *   the positive one; the sign will be set correctly by the
         *   differencing 
         */
        if (get_neg(ext1))
            compute_abs_diff_into(new_ext, ext2, ext1);
        else
            compute_abs_diff_into(new_ext, ext1, ext2);
    }
}